

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageViewPrivate::layoutControl(PageViewPrivate *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QSize controlSize;
  
  iVar3 = (**(code **)(*(long *)this->control + 0x80))(this->control,(r->x2 - r->x1) + 1);
  iVar1 = r->y2;
  iVar2 = this->controlOffset;
  QWidget::resize((QSize *)this->control);
  QWidget::move(&this->control->super_QWidget,r->x1,iVar1 - (iVar3 + iVar2));
  return;
}

Assistant:

void
PageViewPrivate::layoutControl( const QRect & r )
{
	const QSize controlSize = QSize( r.width(),
		control->heightForWidth( r.width() ) );

	const int y = r.bottomLeft().y() - controlOffset - controlSize.height();

	control->resize( controlSize );

	control->move( r.topLeft().x(), y );
}